

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatictext.cpp
# Opt level: O1

int __thiscall QStaticTextPrivate::init(QStaticTextPrivate *this,EVP_PKEY_CTX *ctx)

{
  QFontDef *pQVar1;
  int *piVar2;
  byte *pbVar3;
  undefined8 *puVar4;
  byte bVar5;
  QStaticTextItem *pQVar6;
  QStaticTextUserData *pQVar7;
  QFontPrivate *pQVar8;
  QPaintEnginePrivate *pQVar9;
  _func_int **__src;
  QPaintEngineState *pQVar10;
  QArrayData *pQVar11;
  QPaintEnginePrivate *__src_00;
  _func_int **pp_Var12;
  undefined1 auVar13 [16];
  ulong uVar14;
  undefined8 uVar15;
  QStaticTextItem *pQVar16;
  QPaintEngine *this_00;
  ulong *puVar17;
  glyph_t *__dest;
  QFixedPoint *__s;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  QFont *pQVar22;
  long in_FS_OFFSET;
  QPainter painter;
  QArrayDataPointer<QStaticTextItem> local_88;
  QPainter local_70;
  undefined1 local_68 [16];
  QPaintEngine *local_58;
  QColor local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = this->items;
  if (pQVar6 != (QStaticTextItem *)0x0) {
    pQVar7 = pQVar6[-1].m_userData.d.ptr;
    if (pQVar7 != (QStaticTextUserData *)0x0) {
      pQVar22 = &pQVar6[(long)((long)&pQVar7[-1].type + 3)].font;
      lVar19 = (long)pQVar7 * -0x50;
      do {
        pQVar8 = pQVar22[3].d.d.ptr;
        if (pQVar8 != (QFontPrivate *)0x0) {
          LOCK();
          pQVar1 = &pQVar8->request;
          *(int *)&(pQVar1->families).d.d = *(int *)&(pQVar1->families).d.d + -1;
          UNLOCK();
          if ((*(int *)&(pQVar1->families).d.d == 0) &&
             (pQVar8 = pQVar22[3].d.d.ptr, pQVar8 != (QFontPrivate *)0x0)) {
            (**(code **)(*(long *)pQVar8 + 8))();
          }
        }
        if (*(long *)&pQVar22[2].resolve_mask != 0) {
          LOCK();
          piVar2 = (int *)(*(long *)&pQVar22[2].resolve_mask + 0xc);
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) && (*(long **)&pQVar22[2].resolve_mask != (long *)0x0)) {
            (**(code **)(**(long **)&pQVar22[2].resolve_mask + 8))();
          }
        }
        QFont::~QFont(pQVar22);
        pQVar22 = pQVar22 + -5;
        lVar19 = lVar19 + 0x50;
      } while (lVar19 != 0);
    }
    operator_delete__(&pQVar6[-1].m_userData,(long)pQVar7 * 0x50 + 8);
  }
  if (this->glyphPool != (glyph_t *)0x0) {
    operator_delete__(this->glyphPool);
  }
  if (this->positionPool != (QFixedPoint *)0x0) {
    operator_delete__(this->positionPool);
  }
  (this->position).xp = 0.0;
  (this->position).yp = 0.0;
  local_58 = (QPaintEngine *)&DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  bVar5 = this->field_0xe0;
  QPaintDevice::QPaintDevice((QPaintDevice *)local_68);
  local_68._0_8_ = &PTR__DrawTextItemDevice_007eda58;
  this_00 = (QPaintEngine *)operator_new(0x80);
  QPaintEngine::QPaintEngine(this_00,(PaintEngineFeatures)0x0);
  this_00->_vptr_QPaintEngine = (_func_int **)&PTR__DrawTextItemRecorder_007edac0;
  this_00[1]._vptr_QPaintEngine = (_func_int **)0x0;
  this_00[1].state = (QPaintEngineState *)0x0;
  *(undefined8 *)&this_00[1].gccaps = 0;
  this_00[1].d_ptr.d = (QPaintEnginePrivate *)0x0;
  this_00[2]._vptr_QPaintEngine = (_func_int **)0x0;
  this_00[2].state = (QPaintEngineState *)0x0;
  *(undefined8 *)&this_00[2].gccaps = 0;
  this_00[2].d_ptr.d = (QPaintEnginePrivate *)0x0;
  *(undefined8 *)((long)&this_00[2].d_ptr.d + 1) = 0;
  *(undefined8 *)((long)&this_00[3]._vptr_QPaintEngine + 1) = 0;
  *(byte *)((long)&this_00[3].state + 1) = bVar5 >> 1 & 1;
  *(byte *)((long)&this_00[3].state + 2) = bVar5 >> 4 & 1;
  *(undefined4 *)((long)&this_00[3].state + 4) = 1;
  *(undefined8 *)&this_00[3].gccaps = 0;
  *(undefined2 *)&this_00[3].d_ptr.d = 0;
  local_70.d_ptr._M_t.super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
  _M_t.super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
  super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
       (unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = this_00;
  QPainter::QPainter(&local_70,(QPaintDevice *)local_68);
  QPainter::setFont(&local_70,&this->font);
  QPainter::setTransform(&local_70,&this->matrix,false);
  local_88.d = (Data *)0x0;
  local_88.ptr = (QStaticTextItem *)0x0;
  local_48.cspec = Rgb;
  local_48.ct._0_8_ = 0;
  local_48.ct.argb.pad = 0;
  paintText(this,(QPointF *)&local_88,&local_70,&local_48);
  QPainter::~QPainter(&local_70);
  local_88.d = (Data *)local_58[1]._vptr_QPaintEngine;
  local_88.ptr = (QStaticTextItem *)local_58[1].state;
  local_88.size = *(qsizetype *)&local_58[1].gccaps;
  if (local_88.d != (Data *)0x0) {
    LOCK();
    ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar9 = local_58[1].d_ptr.d;
  __src = local_58[2]._vptr_QPaintEngine;
  pQVar10 = local_58[2].state;
  if (pQVar9 != (QPaintEnginePrivate *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&pQVar9->_vptr_QPaintEnginePrivate)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&pQVar9->_vptr_QPaintEnginePrivate)->_q_value).
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar11 = *(QArrayData **)&local_58[2].gccaps;
  __src_00 = local_58[2].d_ptr.d;
  pp_Var12 = local_58[3]._vptr_QPaintEngine;
  if (pQVar11 != (QArrayData *)0x0) {
    LOCK();
    (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  uVar21 = (ulong)(int)local_88.size;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar21;
  this->itemCount = (int)local_88.size;
  uVar18 = 0xffffffffffffffff;
  if (SUB168(auVar13 * ZEXT816(0x50),8) == 0) {
    uVar18 = SUB168(auVar13 * ZEXT816(0x50),0) | 8;
  }
  uVar14 = local_88.size & 0xffffffff;
  puVar17 = (ulong *)operator_new__(uVar18);
  *puVar17 = uVar21;
  if (uVar14 != 0) {
    lVar19 = 0;
    do {
      QFont::QFont((QFont *)((long)puVar17 + lVar19 + 0x20));
      *(undefined4 *)((long)puVar17 + lVar19 + 0x30) = 0;
      *(undefined2 *)((long)puVar17 + lVar19 + 0x34) = 0xffff;
      *(undefined8 *)((long)puVar17 + lVar19 + 0x36) = 0;
      pbVar3 = (byte *)((long)puVar17 + lVar19 + 0x40);
      *pbVar3 = *pbVar3 & 0xf8;
      puVar4 = (undefined8 *)((long)puVar17 + lVar19 + 0x48);
      *puVar4 = 0;
      puVar4[1] = 0;
      lVar19 = lVar19 + 0x50;
    } while (uVar21 * 0x50 != lVar19);
  }
  this->items = (QStaticTextItem *)(puVar17 + 1);
  uVar18 = (long)pp_Var12 << 2;
  __dest = (glyph_t *)operator_new__(uVar18);
  this->glyphPool = __dest;
  memcpy(__dest,__src_00,uVar18);
  uVar18 = (long)pQVar10 * 8;
  __s = (QFixedPoint *)operator_new__(uVar18);
  if (pQVar10 != (QPaintEngineState *)0x0) {
    memset(__s,0,uVar18);
  }
  this->positionPool = __s;
  memcpy(__s,__src,uVar18);
  if (0 < this->itemCount) {
    lVar20 = 0;
    lVar19 = 0;
    do {
      pQVar16 = local_88.ptr;
      pQVar6 = this->items;
      puVar4 = (undefined8 *)((long)&(local_88.ptr)->field_0 + lVar20);
      pQVar22 = (QFont *)((long)&(pQVar6->font).d.d.ptr + lVar20);
      pQVar22[-1].resolve_mask = *(uint *)(puVar4 + 2);
      pQVar8 = (QFontPrivate *)puVar4[1];
      *(undefined8 *)&pQVar22[-2].resolve_mask = *puVar4;
      pQVar22[-1].d.d.ptr = pQVar8;
      QFont::operator=(pQVar22,(QFont *)(puVar4 + 3));
      uVar15 = puVar4[6];
      pQVar22[1].d.d.ptr = (QFontPrivate *)puVar4[5];
      *(undefined8 *)&pQVar22[1].resolve_mask = uVar15;
      *(undefined1 *)&pQVar22[2].d.d.ptr = *(undefined1 *)(puVar4 + 7);
      QExplicitlySharedDataPointer<QFontEngine>::operator=
                ((QExplicitlySharedDataPointer<QFontEngine> *)
                 ((long)&(pQVar6->m_fontEngine).d.ptr + lVar20),
                 (QExplicitlySharedDataPointer<QFontEngine> *)
                 ((long)&(pQVar16->m_fontEngine).d.ptr + lVar20));
      QExplicitlySharedDataPointer<QStaticTextUserData>::operator=
                ((QExplicitlySharedDataPointer<QStaticTextUserData> *)
                 ((long)&(pQVar6->m_userData).d.ptr + lVar20),
                 (QExplicitlySharedDataPointer<QStaticTextUserData> *)
                 ((long)&(pQVar16->m_userData).d.ptr + lVar20));
      *(glyph_t **)((long)&this->items->field_1 + lVar20) =
           this->glyphPool + *(int *)((long)&this->items->field_1 + lVar20);
      *(QFixedPoint **)((long)&this->items->field_0 + lVar20) =
           this->positionPool + *(int *)((long)&this->items->field_0 + lVar20);
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 0x50;
    } while (lVar19 < this->itemCount);
  }
  this->field_0xe0 = this->field_0xe0 & 0xfe;
  if (pQVar11 != (QArrayData *)0x0) {
    LOCK();
    (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar11,4,0x10);
    }
  }
  if (pQVar9 != (QPaintEnginePrivate *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&pQVar9->_vptr_QPaintEnginePrivate)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&pQVar9->_vptr_QPaintEnginePrivate)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&pQVar9->_vptr_QPaintEnginePrivate)->_q_value).super___atomic_base<int>
        ._M_i == 0) {
      QArrayData::deallocate((QArrayData *)pQVar9,8,0x10);
    }
  }
  QArrayDataPointer<QStaticTextItem>::~QArrayDataPointer(&local_88);
  local_68._0_8_ = &PTR__DrawTextItemDevice_007eda58;
  if (local_58 != (QPaintEngine *)0x0) {
    (*local_58->_vptr_QPaintEngine[1])();
  }
  QPaintDevice::~QPaintDevice((QPaintDevice *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QStaticTextPrivate::init()
{
    delete[] items;
    delete[] glyphPool;
    delete[] positionPool;

    position = QPointF(0, 0);

    DrawTextItemDevice device(untransformedCoordinates, useBackendOptimizations);
    {
        QPainter painter(&device);
        painter.setFont(font);
        painter.setTransform(matrix);

        paintText(QPointF(0, 0), &painter, QColor(0, 0, 0, 0));
    }

    QList<QStaticTextItem> deviceItems = device.items();
    QList<QFixedPoint> positions = device.positions();
    QList<glyph_t> glyphs = device.glyphs();

    itemCount = deviceItems.size();
    items = new QStaticTextItem[itemCount];

    glyphPool = new glyph_t[glyphs.size()];
    memcpy(glyphPool, glyphs.constData(), glyphs.size() * sizeof(glyph_t));

    positionPool = new QFixedPoint[positions.size()];
    memcpy(positionPool, positions.constData(), positions.size() * sizeof(QFixedPoint));

    for (int i=0; i<itemCount; ++i) {
        items[i] = deviceItems.at(i);

        items[i].glyphs = glyphPool + items[i].glyphOffset;
        items[i].glyphPositions = positionPool + items[i].positionOffset;
    }

    needsRelayout = false;
}